

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

FT_Pointer
ft_mem_qrealloc(FT_Memory memory,FT_Long item_size,FT_Long cur_count,FT_Long new_count,void *block,
               FT_Error *p_error)

{
  undefined1 auVar1 [16];
  FT_Long new_size;
  FT_Long cur_size;
  FT_Pointer block2;
  FT_Error error;
  FT_Error *p_error_local;
  void *block_local;
  FT_Long new_count_local;
  FT_Long cur_count_local;
  FT_Long item_size_local;
  FT_Memory memory_local;
  
  block2._4_4_ = 0;
  p_error_local = (FT_Error *)block;
  if (((cur_count < 0) || (new_count < 0)) || (item_size < 0)) {
    block2._4_4_ = 6;
  }
  else if ((new_count == 0) || (item_size == 0)) {
    ft_mem_free(memory,block);
    p_error_local = (FT_Error *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SUB168(SEXT816(0x7fffffff),8);
    if (SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffff)) / SEXT816(item_size),0) < new_count) {
      block2._4_4_ = 10;
    }
    else if (cur_count == 0) {
      p_error_local = (FT_Error *)(*memory->alloc)(memory,new_count * item_size);
      if (p_error_local == (FT_Error *)0x0) {
        block2._4_4_ = 0x40;
      }
    }
    else {
      p_error_local =
           (FT_Error *)(*memory->realloc)(memory,cur_count * item_size,new_count * item_size,block);
      if (p_error_local == (FT_Error *)0x0) {
        block2._4_4_ = 0x40;
        p_error_local = (FT_Error *)block;
      }
    }
  }
  *p_error = block2._4_4_;
  return p_error_local;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_qrealloc( FT_Memory  memory,
                   FT_Long    item_size,
                   FT_Long    cur_count,
                   FT_Long    new_count,
                   void*      block,
                   FT_Error  *p_error )
  {
    FT_Error  error = FT_Err_Ok;


    /* Note that we now accept `item_size == 0' as a valid parameter, in
     * order to cover very weird cases where an ALLOC_MULT macro would be
     * called.
     */
    if ( cur_count < 0 || new_count < 0 || item_size < 0 )
    {
      /* may help catch/prevent nasty security issues */
      error = FT_THROW( Invalid_Argument );
    }
    else if ( new_count == 0 || item_size == 0 )
    {
      ft_mem_free( memory, block );
      block = NULL;
    }
    else if ( new_count > FT_INT_MAX / item_size )
    {
      error = FT_THROW( Array_Too_Large );
    }
    else if ( cur_count == 0 )
    {
      FT_ASSERT( !block );

      block = memory->alloc( memory, new_count * item_size );
      if ( block == NULL )
        error = FT_THROW( Out_Of_Memory );
    }
    else
    {
      FT_Pointer  block2;
      FT_Long     cur_size = cur_count * item_size;
      FT_Long     new_size = new_count * item_size;


      block2 = memory->realloc( memory, cur_size, new_size, block );
      if ( !block2 )
        error = FT_THROW( Out_Of_Memory );
      else
        block = block2;
    }

    *p_error = error;
    return block;
  }